

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_s32__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint32 dVar1;
  uchar *in_RSI;
  drwav *in_RDI;
  drwav_uint64 samplesRead;
  uchar sampleData [4096];
  drwav_uint64 totalSamplesRead;
  drwav_uint32 bytesPerSample;
  uchar *puVar2;
  drwav *totalSampleCount;
  uchar *pIn;
  drwav_int32 *in_stack_ffffffffffffefc0;
  drwav_uint64 in_stack_ffffffffffffefc8;
  drwav *in_stack_ffffffffffffefd0;
  drwav_uint64 local_30;
  uchar *local_18;
  drwav_uint64 local_8;
  
  dVar1 = drwav_get_bytes_per_sample(in_RDI);
  if (dVar1 == 0) {
    local_8 = 0;
  }
  else {
    local_30 = 0;
    for (local_18 = in_RSI; local_18 != (uchar *)0x0;
        local_18 = local_18 + -(long)in_stack_ffffffffffffefc0) {
      puVar2 = local_18;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(dVar1),0) <= local_18) {
        puVar2 = (uchar *)0x0;
      }
      totalSampleCount = in_RDI;
      pIn = local_18;
      in_stack_ffffffffffffefc0 =
           (drwav_int32 *)
           drwav_read(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0)
      ;
      if (in_stack_ffffffffffffefc0 == (drwav_int32 *)0x0) break;
      drwav__ieee_to_s32(in_stack_ffffffffffffefc0,pIn,(size_t)totalSampleCount,
                         (uint)((ulong)puVar2 >> 0x20));
      local_30 = (long)in_stack_ffffffffffffefc0 + local_30;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

drwav_uint64 drwav_read_s32__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s32(pBufferOut, sampleData, (size_t)samplesRead, bytesPerSample);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}